

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

int __thiscall DNSResolve::AddToLoop(DNSResolve *this,EventLoop *event_loop)

{
  int iVar1;
  Log *pLVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  EventLoop *local_20;
  EventLoop *event_loop_local;
  DNSResolve *this_local;
  
  local_20 = event_loop;
  event_loop_local = (EventLoop *)this;
  if (this->event_loop_ == (EventLoop *)0x0) {
    if ((this->is_closed_ & 1U) == 0) {
      iVar1 = socket(2,2,0x11);
      this->dns_socket_ = iVar1;
      SetNoBlocking(this->dns_socket_);
      this->event_loop_ = local_20;
      EventLoop::Add(this->event_loop_,this->dns_socket_,1,&this->super_ISockNotify);
      this_local._4_4_ = 0;
    }
    else {
      pLVar2 = Log::GetInstance();
      pLVar2 = Log::operator<<(pLVar2,red);
      Log::FormatTime_abi_cxx11_();
      pLVar2 = Log::operator<<(pLVar2,&local_70);
      pLVar2 = Log::operator<<(pLVar2,(char (*) [10])" [error] ");
      Log::operator<<(pLVar2,(char (*) [16])"already closed\n");
      std::__cxx11::string::~string((string *)&local_70);
      this_local._4_4_ = -1;
    }
  }
  else {
    pLVar2 = Log::GetInstance();
    pLVar2 = Log::operator<<(pLVar2,red);
    Log::FormatTime_abi_cxx11_();
    pLVar2 = Log::operator<<(pLVar2,&local_40);
    pLVar2 = Log::operator<<(pLVar2,(char (*) [10])" [error] ");
    Log::operator<<(pLVar2,(char (*) [21])"already add to loop\n");
    std::__cxx11::string::~string((string *)&local_40);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int DNSResolve::AddToLoop(EventLoop * event_loop)
{
    if (event_loop_)
    {
        LOGE << "already add to loop\n";
        return -1;
    }
    if (is_closed_)
    {
        LOGE << "already closed\n";
        return -1;
    }
    dns_socket_ = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
    SetNoBlocking(dns_socket_);
    event_loop_ = event_loop;
    event_loop_->Add(dns_socket_, kPollIn, this);
    return 0;
}